

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptional.cxx
# Opt level: O2

bool operator<=(EventLogger *lhs,EventLogger *rhs)

{
  Event local_30;
  
  local_30.Type = COMPARE_EE_LE;
  local_30.Value = lhs->Value;
  local_30.Logger1 = lhs;
  local_30.Logger2 = rhs;
  std::vector<Event,_std::allocator<Event>_>::emplace_back<Event>(&events,&local_30);
  return lhs->Value <= rhs->Value;
}

Assistant:

static bool operator<=(const EventLogger& lhs, const EventLogger& rhs)
{
  events.push_back({ Event::COMPARE_EE_LE, &lhs, &rhs, lhs.Value });
  return lhs.Value <= rhs.Value;
}